

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateTopLevelKotlinMembers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  ImmutableMessageLiteGenerator local_d8;
  int local_68;
  int i;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_38,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
            (&local_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[8],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "public inline fun $message$.copy(block: $message_kt$.Dsl.() -> kotlin.Unit): $message$ =\n  $message_kt$.Dsl._create(this.toBuilder()).apply { block() }._build()\n"
             ,(char (*) [8])0x7a970a,&local_38,(char (*) [11])"message_kt",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  for (local_68 = 0; iVar1 = local_68,
      iVar3 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_),
      iVar1 < iVar3; local_68 = local_68 + 1) {
    pDVar4 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_68);
    bVar2 = IsMapEntry(pDVar4);
    if (!bVar2) {
      pDVar4 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_68);
      ImmutableMessageLiteGenerator(&local_d8,pDVar4,this->context_);
      GenerateTopLevelKotlinMembers(&local_d8,local_18);
      ~ImmutableMessageLiteGenerator(&local_d8);
    }
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateTopLevelKotlinMembers(
    io::Printer* printer) const {
  printer->Print(
      "public inline fun $message$.copy(block: $message_kt$.Dsl.() -> "
      "kotlin.Unit): "
      "$message$ =\n"
      "  $message_kt$.Dsl._create(this.toBuilder()).apply { block() "
      "}._build()\n",
      "message", name_resolver_->GetClassName(descriptor_, true), "message_kt",
      name_resolver_->GetKotlinExtensionsClassName(descriptor_));

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateTopLevelKotlinMembers(printer);
  }
}